

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O2

void __thiscall
burst::k_ary_search_set<int,std::greater<void>>::
initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (k_ary_search_set<int,std::greater<void>> *this,
          iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *range)

{
  int *piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  _Elt_pointer pkVar3;
  ulong uVar4;
  value_type branch;
  vector<unsigned_long,_std::allocator<unsigned_long>_> counters;
  k_ary_search_set_branch local_a8;
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_88;
  stack<burst::k_ary_search_set_branch,_std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>_>
  branches;
  
  _Var2 = std::
          __adjacent_find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::not_fn_t<std::greater<void>>>>
                    ((range->
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                     ).
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                     .m_Begin._M_current,
                     (range->
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                     ).
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
                     .m_End._M_current);
  if (_Var2._M_current ==
      (range->
      super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
      ).
      super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_current) {
    piVar1 = (range->
             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
             ).
             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin._M_current;
    if (piVar1 != _Var2._M_current) {
      local_88 = range;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)this,
                 (long)_Var2._M_current - (long)piVar1 >> 2);
      std::
      stack<burst::k_ary_search_set_branch,std::deque<burst::k_ary_search_set_branch,std::allocator<burst::k_ary_search_set_branch>>>
      ::
      stack<std::deque<burst::k_ary_search_set_branch,std::allocator<burst::k_ary_search_set_branch>>,void>
                (&branches);
      branch.index = 0;
      branch.size = *(long *)(this + 8) - *(long *)this >> 2;
      branch.height =
           k_ary_search_set<int,_std::greater<void>_>::perfect_tree_height
                     (*(size_t *)(this + 0x18),branch.size);
      branch.preceding_elements = 0;
      std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
      emplace_back<burst::k_ary_search_set_branch>(&branches.c,&branch);
      while (branches.c.
             super__Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             branches.c.
             super__Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        pkVar3 = branches.c.
                 super__Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (branches.c.
            super__Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            branches.c.
            super__Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pkVar3 = branches.c.
                   super__Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        branch.index = pkVar3[-1].index;
        branch.size = pkVar3[-1].size;
        branch.height = pkVar3[-1].height;
        branch.preceding_elements = pkVar3[-1].preceding_elements;
        std::deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
        ::pop_back(&branches.c);
        counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        k_ary_search_set<int,_std::greater<void>_>::fill_counters
                  ((k_ary_search_set<int,_std::greater<void>_> *)this,&branch,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        fill_node<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
                  (this,&branch,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
                   local_88);
        if (*counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start != 0) {
          local_a8.index = (*(long *)(this + 0x18) + branch.index * *(long *)(this + 0x18)) - 1;
          local_a8.size =
               *counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
          local_a8.height = branch.height - 1;
          local_a8.preceding_elements = branch.preceding_elements;
          std::
          deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
          emplace_back<burst::k_ary_search_set_branch>(&branches.c,&local_a8);
        }
        uVar4 = 1;
        while ((uVar4 < (ulong)((long)counters.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)counters.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) &&
               (counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4] !=
                counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4 - 1] + 1))) {
          local_a8.index =
               (*(long *)(this + 0x18) + -1) * (uVar4 + 1) + branch.index * *(long *)(this + 0x18);
          local_a8.size =
               ~counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4 - 1] +
               counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
          local_a8.height = branch.height - 1;
          local_a8.preceding_elements =
               counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4 - 1] + branch.preceding_elements + 1;
          std::
          deque<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
          emplace_back<burst::k_ary_search_set_branch>(&branches.c,&local_a8);
          uVar4 = uVar4 + 1;
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&counters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      }
      std::
      _Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>::
      ~_Deque_base((_Deque_base<burst::k_ary_search_set_branch,_std::allocator<burst::k_ary_search_set_branch>_>
                    *)&branches);
    }
    return;
  }
  __assert_fail("std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                ,0x149,
                "void burst::k_ary_search_set<int, std::greater<void>>::initialize_trusted(const RandomAccessRange &) [Value = int, Compare = std::greater<void>, RandomAccessRange = boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>]"
               );
}

Assistant:

void initialize_trusted (const RandomAccessRange & range)
        {
            BOOST_ASSERT
            (
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end()
            );
            if (not range.empty())
            {
                m_values.resize(range.size());

                std::stack<k_ary_search_set_branch> branches;

                branches.push({0, size(), perfect_tree_height(m_arity, size()), 0});
                while (not branches.empty())
                {
                    const auto branch = branches.top();
                    branches.pop();

                    // Количество меньших элементов ветки для каждого элемента текущего узла.
                    std::vector<std::size_t> counters;
                    fill_counters(branch, counters);

                    fill_node(branch, counters, range);

                    if (counters[0] > 0)
                    {
                        branches.push
                        ({
                            perfect_tree_child_index(m_arity, branch.index, 0),
                            counters[0],
                            branch.height - 1,
                            branch.preceding_elements
                        });
                    }

                    for
                    (
                        std::size_t i = 1;
                        i < counters.size() && (counters[i] - counters[i - 1] - 1) > 0;
                        ++i
                    )
                    {
                        branches.push
                        ({
                            perfect_tree_child_index(m_arity, branch.index, i),
                            counters[i] - counters[i - 1] - 1,
                            branch.height - 1,
                            branch.preceding_elements + counters[i - 1] + 1
                        });
                    }
                }
            }
        }